

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O0

void __thiscall ThreadPool::RemoveFromJobList(ThreadPool *this,ParallelJob *job)

{
  ParallelJob *job_local;
  ThreadPool *this_local;
  
  if (job->prev == (ParallelJob *)0x0) {
    this->jobList = job->next;
  }
  else {
    job->prev->next = job->next;
  }
  if (job->next != (ParallelJob *)0x0) {
    job->next->prev = job->prev;
  }
  job->removed = true;
  return;
}

Assistant:

void ThreadPool::RemoveFromJobList(ParallelJob *job) {
    assert(!job->removed);

    if (job->prev != nullptr) {
        job->prev->next = job->next;
    } else {
        assert(jobList == job);
        jobList = job->next;
    }
    if (job->next != nullptr)
        job->next->prev = job->prev;

    job->removed = true;
}